

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.hpp
# Opt level: O3

void __thiscall
TasGrid::TasmanianSparseGrid::getQuadratureWeights
          (TasmanianSparseGrid *this,vector<double,_std::allocator<double>_> *weights)

{
  long lVar1;
  int *piVar2;
  size_type __new_size;
  
  lVar1 = *(long *)(this + 8);
  if (lVar1 == 0) {
    __new_size = 0;
  }
  else {
    piVar2 = (int *)(lVar1 + 0x20);
    if (*(long *)(lVar1 + 0x28) == *(long *)(lVar1 + 0x30)) {
      piVar2 = (int *)(lVar1 + 0x48);
    }
    __new_size = (size_type)*piVar2;
  }
  std::vector<double,_std::allocator<double>_>::resize(weights,__new_size);
  TasGrid::TasmanianSparseGrid::getQuadratureWeights((double *)this);
  return;
}

Assistant:

void getQuadratureWeights(std::vector<double> &weights) const{ weights.resize((size_t) getNumPoints()); getQuadratureWeights(weights.data()); }